

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

void __thiscall
kj::MainBuilder::MainBuilder
          (MainBuilder *this,ProcessContext *context,StringPtr version,StringPtr briefDescription,
          StringPtr extendedDescription)

{
  Impl *pIVar1;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr helpText;
  StringPtr helpText_00;
  OptionName local_60;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_50;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_40;
  StringPtr briefDescription_local;
  StringPtr version_local;
  
  briefDescription_local.content.size_ = briefDescription.content.size_;
  briefDescription_local.content.ptr = briefDescription.content.ptr;
  version_local.content.size_ = version.content.size_;
  version_local.content.ptr = version.content.ptr;
  heap<kj::MainBuilder::Impl,kj::ProcessContext&,kj::StringPtr&,kj::StringPtr&,kj::StringPtr&>
            ((kj *)this,context,&version_local,&briefDescription_local,&extendedDescription);
  local_60.isLong = true;
  local_60.field_1.longName = "verbose";
  pIVar1 = (this->impl).ptr;
  local_40.ptr = (Iface *)operator_new(0x18);
  (local_40.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0021ea60;
  local_40.ptr[1]._vptr_Iface = (_func_int **)pIVar1;
  local_40.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<kj::MainBuilder::Impl&,kj::MainBuilder::Impl(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::$_0,kj::MainBuilder::$_0(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::$_1>>>
        ::instance;
  names._M_len = 1;
  names._M_array = &local_60;
  helpText.content.size_ = 0x3c;
  helpText.content.ptr = "Log informational messages to stderr; useful for debugging.";
  addOption(this,names,(Function<kj::MainBuilder::Validity_()> *)&local_40,helpText);
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_40);
  local_60.isLong = true;
  local_60.field_1.longName = "version";
  pIVar1 = (this->impl).ptr;
  local_50.ptr = (Iface *)operator_new(0x18);
  (local_50.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0021eac8;
  local_50.ptr[1]._vptr_Iface = (_func_int **)pIVar1;
  local_50.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<kj::MainBuilder::Impl&,kj::MainBuilder::Impl(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::$_2,kj::MainBuilder::$_2(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::$_3>>>
        ::instance;
  names_00._M_len = 1;
  names_00._M_array = &local_60;
  helpText_00.content.size_ = 0x24;
  helpText_00.content.ptr = "Print version information and exit.";
  addOption(this,names_00,(Function<kj::MainBuilder::Validity_()> *)&local_50,helpText_00);
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_50);
  return;
}

Assistant:

MainBuilder::MainBuilder(ProcessContext& context, StringPtr version,
                         StringPtr briefDescription, StringPtr extendedDescription)
    : impl(heap<Impl>(context, version, briefDescription, extendedDescription)) {
  addOption({"verbose"}, KJ_BIND_METHOD(*impl, increaseVerbosity),
            "Log informational messages to stderr; useful for debugging.");
  addOption({"version"}, KJ_BIND_METHOD(*impl, printVersion),
            "Print version information and exit.");
}